

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImBezierCubicClosestPoint
                 (ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 p_last;
  ImVec2 p_current;
  
  if (num_segments < 1) {
    __assert_fail("num_segments > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x58a,
                  "ImVec2 ImBezierCubicClosestPoint(const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, int)"
                 );
  }
  fVar5 = 0.0;
  fVar6 = 0.0;
  fVar7 = 3.4028235e+38;
  p_last = *p1;
  for (iVar4 = 1; iVar4 - num_segments != 1; iVar4 = iVar4 + 1) {
    IVar1 = ImBezierCubicCalc(p1,p2,p3,p4,(float)iVar4 * (1.0 / (float)num_segments));
    p_current = IVar1;
    IVar2 = ImLineClosestPoint(&p_last,&p_current,p);
    fVar8 = p->x - IVar2.x;
    fVar9 = p->y - IVar2.y;
    fVar8 = fVar8 * fVar8 + fVar9 * fVar9;
    fVar9 = IVar2.y;
    fVar3 = IVar2.x;
    if (fVar7 <= fVar8) {
      fVar8 = fVar7;
      fVar9 = fVar6;
      fVar3 = fVar5;
    }
    fVar5 = fVar3;
    fVar6 = fVar9;
    fVar7 = fVar8;
    p_last = IVar1;
  }
  IVar1.y = fVar6;
  IVar1.x = fVar5;
  return IVar1;
}

Assistant:

ImVec2 ImBezierCubicClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierCubicClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCubicCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}